

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv6Transmitter::Destroy(RTPUDPv6Transmitter *this)

{
  uint8_t *buf;
  RTPMemoryManager *mgr;
  RTPUDPv6Transmitter *this_local;
  
  if (((this->init & 1U) != 0) && ((this->created & 1U) != 0)) {
    if (this->localhostname != (uint8_t *)0x0) {
      buf = this->localhostname;
      mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      RTPDeleteByteArray(buf,mgr);
      this->localhostname = (uint8_t *)0x0;
      this->localhostnamelength = 0;
    }
    close(this->rtpsock);
    close(this->rtcpsock);
    RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
    ::Clear(&this->destinations);
    RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::Clear
              (&this->multicastgroups);
    FlushPackets(this);
    ClearAcceptIgnoreInfo(this);
    std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::clear(&this->localIPs);
    this->created = false;
    if ((this->waitingfordata & 1U) == 0) {
      RTPAbortDescriptors::Destroy(&this->m_abortDesc);
    }
    else {
      RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
      RTPAbortDescriptors::Destroy(&this->m_abortDesc);
    }
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::Destroy()
{
	if (!init)
		return;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK;
		return;
	}

	if (localhostname)
	{
		RTPDeleteByteArray(localhostname,GetMemoryManager());
		localhostname = 0;
		localhostnamelength = 0;
	}
	
	RTPCLOSE(rtpsock);
	RTPCLOSE(rtcpsock);
	destinations.Clear();
#ifdef RTP_SUPPORT_IPV6MULTICAST
	multicastgroups.Clear();
#endif // RTP_SUPPORT_IPV6MULTICAST
	FlushPackets();
	ClearAcceptIgnoreInfo();
	localIPs.clear();
	created = false;
	
	if (waitingfordata)
	{
		m_pAbortDesc->SendAbortSignal();
		m_abortDesc.Destroy(); // Doesn't do anything if not initialized
		MAINMUTEX_UNLOCK
		WAITMUTEX_LOCK // to make sure that the WaitForIncomingData function ended
		WAITMUTEX_UNLOCK
	}
	else
		m_abortDesc.Destroy(); // Doesn't do anything if not initialized

	MAINMUTEX_UNLOCK
}